

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ReplaceObsoleteElements(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  TidyTagId TVar2;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      if (node->tag != (Dict *)0x0) {
        TVar2 = node->tag->id;
        if (TVar2 == TidyTag_DIR) {
          prvTidyCoerceNode(doc,node,TidyTag_UL,yes,yes);
          if (node->tag == (Dict *)0x0) goto LAB_001426c1;
          TVar2 = node->tag->id;
        }
        if ((TVar2 - TidyTag_LISTING < 0x3b) &&
           ((0x400000000100001U >> ((ulong)(TVar2 - TidyTag_LISTING) & 0x3f) & 1) != 0)) {
          prvTidyCoerceNode(doc,node,TidyTag_PRE,yes,yes);
        }
      }
LAB_001426c1:
      if (node->content != (Node *)0x0) {
        ReplaceObsoleteElements(doc,node->content);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

static void ReplaceObsoleteElements(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        /* if (nodeIsDIR(node) || nodeIsMENU(node)) */
        /* HTML5 - <menu ... > is no longer obsolete */
        if (nodeIsDIR(node))
            TY_(CoerceNode)(doc, node, TidyTag_UL, yes, yes);

        if (nodeIsXMP(node) || nodeIsLISTING(node) ||
            (node->tag && node->tag->id == TidyTag_PLAINTEXT))
            TY_(CoerceNode)(doc, node, TidyTag_PRE, yes, yes);

        if (node->content)
            ReplaceObsoleteElements(doc, node->content);

        node = next;
    }
}